

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.cpp
# Opt level: O1

void BrotliCompressFragmentTwoPassImpl13
               (BrotliTwoPassArena *s,uint8_t *input,size_t input_size,int is_last,
               uint32_t *command_buf,uint8_t *literal_buf,int *table,size_t *storage_ix,
               uint8_t *storage)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint8_t *s1_orig;
  size_t input_size_00;
  uint32_t *puVar6;
  long lVar7;
  byte bVar8;
  undefined4 in_register_0000000c;
  size_t *commands;
  ulong *puVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  ulong *puVar13;
  ulong *puVar14;
  uint32_t *input_00;
  uint32_t *puVar15;
  uint32_t *puVar16;
  uint32_t *puVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  uint32_t *puVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  size_t *unaff_R15;
  bool bVar27;
  size_t *local_a0;
  uint32_t *local_98;
  
  commands = (size_t *)CONCAT44(in_register_0000000c,is_last);
  input_00 = (uint32_t *)input;
  if (input_size != 0) {
    do {
      input_size_00 = 0x20000;
      if (input_size < 0x20000) {
        input_size_00 = input_size;
      }
      puVar6 = (uint32_t *)(input_size_00 + (long)input_00);
      puVar16 = input_00;
      local_a0 = commands;
      local_98 = command_buf;
      if (0xf < input_size) {
        uVar22 = input_size - 0x10;
        if (input_size_00 - 4 < input_size - 0x10) {
          uVar22 = input_size_00 - 4;
        }
        puVar23 = (uint32_t *)(uVar22 + (long)input_00);
        puVar15 = (uint32_t *)((long)input_00 + 1);
        uVar24 = (ulong)(*(long *)((long)input_00 + 1) * 0x1e35a7bd00000000) >> 0x33;
        uVar22 = 0xffffffff;
LAB_01c4f3d3:
        iVar20 = (int)uVar22;
        uVar11 = 0x20;
        do {
          puVar17 = (uint32_t *)((ulong)(uVar11 >> 5) + (long)puVar15);
          iVar26 = (int)input;
          iVar12 = (int)puVar15;
          if (puVar23 < puVar17) {
            lVar7 = 7;
          }
          else {
            uVar25 = (ulong)(*(long *)puVar17 * 0x1e35a7bd00000000) >> 0x33;
            if ((*puVar15 == *(uint32_t *)((long)puVar15 + -(long)iVar20)) && (0 < iVar20)) {
              unaff_R15 = (size_t *)(-(long)iVar20 + (long)puVar15);
              *(int *)(literal_buf + uVar24 * 4) = iVar12 - iVar26;
              lVar7 = 5;
              uVar24 = uVar25;
            }
            else {
              unaff_R15 = (size_t *)(input + *(int *)(literal_buf + uVar24 * 4));
              *(int *)(literal_buf + uVar24 * 4) = iVar12 - iVar26;
              lVar7 = 0;
              uVar24 = uVar25;
            }
          }
          if ((int)lVar7 == 5) {
LAB_01c4f449:
            uVar25 = (long)puVar15 - (long)unaff_R15;
            if ((long)uVar25 < 0x3fff1) goto LAB_01c4f46c;
          }
          else {
            if ((int)lVar7 != 0) goto LAB_01c4f9b3;
            if (*puVar15 == (uint32_t)*unaff_R15) goto LAB_01c4f449;
          }
          uVar11 = uVar11 + 1;
          puVar15 = puVar17;
        } while( true );
      }
LAB_01c4f9f2:
      if (puVar16 < puVar6) {
        uVar11 = (uint)((long)puVar6 - (long)puVar16);
        if (5 < uVar11) {
          if (uVar11 < 0x82) {
            uVar11 = uVar11 - 2;
            uVar4 = 0x1f;
            if (uVar11 != 0) {
              for (; uVar11 >> uVar4 == 0; uVar4 = uVar4 - 1) {
              }
            }
            bVar8 = (char)(uVar4 ^ 0xffffffe0) + 0x1f;
            uVar5 = uVar11 >> (bVar8 & 0x1f);
            uVar11 = (uVar11 - (uVar5 << (bVar8 & 0x1f))) * 0x100 |
                     uVar5 + (uVar4 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (uVar11 < 0x842) {
            uVar4 = 0x1f;
            if (uVar11 - 0x42 != 0) {
              for (; uVar11 - 0x42 >> uVar4 == 0; uVar4 = uVar4 - 1) {
              }
            }
            uVar11 = (((-1 << ((byte)uVar4 & 0x1f)) + uVar11 + -0x42) * 0x100 - (uVar4 ^ 0x1f)) +
                     0x29;
          }
          else {
            iVar20 = uVar11 * 0x100;
            if (uVar11 < 0x1842) {
              uVar11 = iVar20 - 0x841eb;
            }
            else if (uVar11 < 0x5842) {
              uVar11 = iVar20 - 0x1841ea;
            }
            else {
              uVar11 = iVar20 - 0x5841e9;
            }
          }
        }
        *(uint *)local_a0 = uVar11;
        local_a0 = (size_t *)((long)local_a0 + 4);
        uVar22 = (long)puVar6 - (long)puVar16 & 0xffffffff;
        switchD_01602a8a::default(local_98,puVar16,uVar22);
        local_98 = (uint32_t *)((long)local_98 + uVar22);
      }
      iVar20 = ShouldCompress(s,(uint8_t *)input_00,input_size_00,(long)local_98 - (long)command_buf
                             );
      if (iVar20 == 0) {
        BrotliStoreMetaBlockHeader(input_size_00,1,(size_t *)table,(uint8_t *)storage_ix);
        iVar20 = *table;
        *(ulong *)table = (ulong)(iVar20 + 7U & 0xfffffff8);
        switchD_01602a8a::default
                  ((void *)((ulong)(iVar20 + 7U >> 3) + (long)storage_ix),input_00,input_size_00);
        uVar22 = input_size_00 * 8 + *(long *)table;
        *(ulong *)table = uVar22;
        *(undefined1 *)((long)storage_ix + (uVar22 >> 3)) = 0;
        unaff_R15 = storage_ix;
      }
      else {
        BrotliStoreMetaBlockHeader(input_size_00,0,(size_t *)table,(uint8_t *)storage_ix);
        uVar22 = *(ulong *)table;
        uVar24 = uVar22 >> 3;
        *(ulong *)((long)storage_ix + uVar24) = (ulong)*(byte *)((long)storage_ix + uVar24);
        *(ulong *)table = uVar22 + 0xd;
        StoreCommands(s,(uint8_t *)command_buf,(long)local_98 - (long)command_buf,
                      (uint32_t *)commands,(long)local_a0 - (long)commands >> 2,(size_t *)table,
                      (uint8_t *)storage_ix);
        unaff_R15 = commands;
      }
      input_size = input_size - input_size_00;
      input_00 = puVar6;
    } while (input_size != 0);
  }
  return;
LAB_01c4f46c:
  puVar1 = (ulong *)((long)unaff_R15 + 4);
  puVar13 = (ulong *)(puVar15 + 1);
  puVar17 = puVar23;
  puVar9 = puVar1;
  for (uVar18 = (long)puVar6 + (-4 - (long)puVar15); 7 < uVar18; uVar18 = uVar18 - 8) {
    uVar21 = *puVar13;
    uVar2 = *puVar9;
    if (uVar21 == uVar2) {
      puVar9 = puVar9 + 1;
    }
    else {
      uVar3 = 0;
      if ((uVar2 ^ uVar21) != 0) {
        for (; ((uVar2 ^ uVar21) >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      puVar17 = (uint32_t *)((long)puVar9 + ((uVar3 >> 3 & 0x1fffffff) - (long)puVar1));
    }
    if (uVar21 != uVar2) goto LAB_01c4f4f6;
    puVar13 = puVar13 + 1;
  }
  puVar14 = puVar9;
  if (uVar18 != 0) {
    puVar14 = (ulong *)((long)puVar9 + uVar18);
    uVar21 = 0;
    do {
      if (*(char *)((long)puVar9 + uVar21) != *(char *)((long)puVar13 + uVar21)) {
        puVar14 = (ulong *)((long)puVar9 + uVar21);
        break;
      }
      uVar21 = uVar21 + 1;
    } while (uVar18 != uVar21);
  }
  puVar17 = (uint32_t *)((long)puVar14 - (long)puVar1);
LAB_01c4f4f6:
  uVar4 = iVar12 - (int)puVar16;
  uVar11 = uVar4;
  if (5 < uVar4) {
    if (uVar4 < 0x82) {
      uVar5 = uVar4 - 2;
      uVar11 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      bVar8 = (char)(uVar11 ^ 0xffffffe0) + 0x1f;
      uVar19 = uVar5 >> (bVar8 & 0x1f);
      uVar11 = (uVar5 - (uVar19 << (bVar8 & 0x1f))) * 0x100 |
               uVar19 + (uVar11 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar4 < 0x842) {
      uVar11 = 0x1f;
      if (uVar4 - 0x42 != 0) {
        for (; uVar4 - 0x42 >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      uVar11 = (((-1 << ((byte)uVar11 & 0x1f)) + uVar4 + -0x42) * 0x100 - (uVar11 ^ 0x1f)) + 0x29;
    }
    else {
      iVar12 = uVar4 * 0x100;
      if (uVar4 < 0x1842) {
        uVar11 = iVar12 - 0x841eb;
      }
      else if (uVar4 < 0x5842) {
        uVar11 = iVar12 - 0x1841ea;
      }
      else {
        uVar11 = iVar12 - 0x5841e9;
      }
    }
  }
  *(uint *)local_a0 = uVar11;
  switchD_01602a8a::default(local_98,puVar16,(long)(int)uVar4);
  uVar11 = 0x40;
  if (iVar20 != (int)uVar25) {
    uVar5 = (int)uVar25 + 3;
    uVar11 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    bVar8 = 0x1e - (char)(uVar11 ^ 0x1f);
    bVar27 = (uVar5 >> (bVar8 & 0x1f) & 1) != 0;
    uVar11 = (uint)bVar27 +
             ((uVar5 - (bVar27 + 2 << (bVar8 & 0x1f))) * 0x100 | (uVar11 ^ 0x1f) * 2 ^ 0x3e) + 0x4c;
    uVar22 = uVar25 & 0xffffffff;
  }
  puVar16 = puVar17 + 1;
  *(uint *)((long)local_a0 + 4) = uVar11;
  if (puVar16 < (uint32_t *)0xc) {
    *(uint *)(local_a0 + 1) = (int)puVar16 + 0x14;
    lVar10 = 0xc;
  }
  else if (puVar16 < (uint32_t *)0x48) {
    uVar11 = 0x1f;
    uVar5 = (uint)(puVar17 + -1);
    if (uVar5 != 0) {
      for (; uVar5 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    bVar8 = (char)(uVar11 ^ 0xffffffe0) + 0x1f;
    uVar25 = (ulong)(puVar17 + -1) >> (bVar8 & 0x3f);
    *(uint *)(local_a0 + 1) =
         (uVar5 - (int)(uVar25 << (bVar8 & 0x3f))) * 0x100 |
         (int)uVar25 + (uVar11 ^ 0xffffffe0) * 2 + 0x5a;
    lVar10 = 0xc;
  }
  else {
    if (puVar16 < (uint32_t *)0x88) {
      *(uint *)(local_a0 + 1) =
           ((uint)(puVar17 + -1) & 0x1f) << 8 | (int)((ulong)(puVar17 + -1) >> 5) + 0x36U;
    }
    else {
      if ((uint32_t *)0x847 < puVar16) {
        *(uint *)(local_a0 + 1) = (int)puVar16 * 0x100 - 0x847c1;
        *(uint *)((long)local_a0 + 0xc) = 0x40;
        lVar10 = 0x10;
        goto LAB_01c4f6cb;
      }
      uVar11 = (int)puVar17 - 0x44;
      iVar20 = 0x1f;
      if (uVar11 != 0) {
        for (; uVar11 >> iVar20 == 0; iVar20 = iVar20 + -1) {
        }
      }
      *(uint *)(local_a0 + 1) =
           ((int)(-1L << ((byte)iVar20 & 0x3f)) + (int)puVar17 + -0x44) * 0x100 + iVar20 + 0x34;
    }
    *(uint *)((long)local_a0 + 0xc) = 0x40;
    lVar10 = 0x10;
  }
LAB_01c4f6cb:
  lVar7 = (long)puVar17 + (long)puVar15;
  puVar15 = (uint32_t *)(lVar7 + 4);
  if (puVar15 < puVar23) {
    uVar25 = *(ulong *)(lVar7 + 1);
    uVar18 = (uVar25 & 0xffffffff000000) * 0x1e35a7bd00 >> 0x33;
    uVar21 = uVar25 * 0x1e35a7bd00000000 >> 0x33;
    iVar20 = (int)puVar15 - iVar26;
    *(int *)(literal_buf + uVar21 * 4) = iVar20 + -3;
    *(int *)(literal_buf + ((uVar25 & 0xffffffff00) * 0x1e35a7bd000000 >> 0x33) * 4) = iVar20 + -2;
    *(int *)(literal_buf + uVar21 * 4) = iVar20 + -1;
    unaff_R15 = (size_t *)(input + *(int *)(literal_buf + uVar18 * 4));
    *(int *)(literal_buf + uVar18 * 4) = iVar20;
    lVar7 = 0;
  }
  else {
    lVar7 = 7;
  }
  local_98 = (uint32_t *)((long)local_98 + (long)(int)uVar4);
  local_a0 = (size_t *)((long)local_a0 + lVar10);
  puVar16 = puVar15;
  if (puVar15 < puVar23) {
    uVar18 = (long)puVar15 - (long)unaff_R15;
    uVar25 = uVar22;
    while ((uVar22 = uVar18, (long)uVar22 < 0x3fff1 && (*puVar16 == (uint32_t)*unaff_R15))) {
      puVar1 = (ulong *)((long)unaff_R15 + 4);
      puVar13 = (ulong *)(puVar16 + 1);
      puVar9 = puVar1;
      for (uVar25 = (long)puVar6 + (-4 - (long)puVar16); 7 < uVar25; uVar25 = uVar25 - 8) {
        uVar18 = *puVar13;
        uVar21 = *puVar9;
        if (uVar18 == uVar21) {
          puVar9 = puVar9 + 1;
        }
        else {
          uVar2 = 0;
          if ((uVar21 ^ uVar18) != 0) {
            for (; ((uVar21 ^ uVar18) >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
            }
          }
          lVar7 = (long)puVar9 + ((uVar2 >> 3 & 0x1fffffff) - (long)puVar1);
        }
        if (uVar18 != uVar21) goto LAB_01c4f82e;
        puVar13 = puVar13 + 1;
      }
      puVar14 = puVar9;
      if (uVar25 != 0) {
        puVar14 = (ulong *)((long)puVar9 + uVar25);
        uVar18 = 0;
        do {
          if (*(char *)((long)puVar9 + uVar18) != *(char *)((long)puVar13 + uVar18)) {
            puVar14 = (ulong *)((long)puVar9 + uVar18);
            break;
          }
          uVar18 = uVar18 + 1;
        } while (uVar25 != uVar18);
      }
      lVar7 = (long)puVar14 - (long)puVar1;
LAB_01c4f82e:
      uVar25 = lVar7 + 4;
      if (uVar25 < 10) {
        uVar11 = (int)uVar25 + 0x26;
      }
      else if (uVar25 < 0x86) {
        uVar11 = 0x1f;
        uVar4 = (uint)(lVar7 - 2U);
        if (uVar4 != 0) {
          for (; uVar4 >> uVar11 == 0; uVar11 = uVar11 - 1) {
          }
        }
        bVar8 = (char)(uVar11 ^ 0xffffffe0) + 0x1f;
        uVar25 = lVar7 - 2U >> (bVar8 & 0x3f);
        uVar11 = (uVar4 - (int)(uVar25 << (bVar8 & 0x3f))) * 0x100 |
                 (int)uVar25 + (uVar11 ^ 0xffffffe0) * 2 + 0x6a;
      }
      else if (uVar25 < 0x846) {
        uVar11 = (int)lVar7 - 0x42;
        iVar20 = 0x1f;
        if (uVar11 != 0) {
          for (; uVar11 >> iVar20 == 0; iVar20 = iVar20 + -1) {
          }
        }
        uVar11 = ((int)(-1L << ((byte)iVar20 & 0x3f)) + (int)lVar7 + -0x42) * 0x100 + iVar20 + 0x34;
      }
      else {
        uVar11 = (int)uVar25 * 0x100 - 0x845c1;
      }
      puVar15 = (uint32_t *)((long)puVar16 + lVar7 + 4);
      *(uint *)local_a0 = uVar11;
      uVar4 = (int)uVar22 + 3;
      uVar11 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      bVar8 = 0x1e - (char)(uVar11 ^ 0x1f);
      bVar27 = (uVar4 >> (bVar8 & 0x1f) & 1) != 0;
      *(uint *)((long)local_a0 + 4) =
           ((uVar4 - (bVar27 + 2 << (bVar8 & 0x1f))) * 0x100 | (uVar11 ^ 0x1f) * 2 ^ 0x3e) +
           (uint)bVar27 + 0x4c;
      if (puVar15 < puVar23) {
        uVar25 = *(ulong *)((long)puVar16 + lVar7 + 1);
        uVar18 = (uVar25 & 0xffffffff000000) * 0x1e35a7bd00 >> 0x33;
        iVar20 = (int)puVar15 - iVar26;
        *(int *)(literal_buf + (uVar25 * 0x1e35a7bd00000000 >> 0x33) * 4) = iVar20 + -3;
        *(int *)(literal_buf + ((uVar25 & 0xffffffff00) * 0x1e35a7bd000000 >> 0x33) * 4) =
             iVar20 + -2;
        *(int *)(literal_buf + ((uVar25 & 0xffffffff0000) * 0x1e35a7bd0000 >> 0x33) * 4) =
             iVar20 + -1;
        unaff_R15 = (size_t *)(input + *(int *)(literal_buf + uVar18 * 4));
        *(int *)(literal_buf + uVar18 * 4) = iVar20;
        lVar7 = 0;
      }
      else {
        lVar7 = 7;
      }
      local_a0 = local_a0 + 1;
      puVar16 = puVar15;
      if (puVar23 <= puVar15) goto LAB_01c4f9b3;
      uVar18 = (long)puVar15 - (long)unaff_R15;
      uVar25 = uVar22;
    }
    puVar15 = (uint32_t *)((long)puVar16 + 1);
    uVar24 = (ulong)(*(long *)((long)puVar16 + 1) * 0x1e35a7bd00000000) >> 0x33;
    lVar7 = 0;
    uVar22 = uVar25;
  }
LAB_01c4f9b3:
  if ((int)lVar7 != 0) goto LAB_01c4f9f2;
  goto LAB_01c4f3d3;
}

Assistant:

void duckdb_brotli::BrotliCompressFragmentTwoPass(
    BrotliTwoPassArena* s, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, uint32_t* command_buf, uint8_t* literal_buf,
    int* table, size_t table_size, size_t* storage_ix, uint8_t* storage) {
  const size_t initial_storage_ix = *storage_ix;
  const size_t table_bits = Log2FloorNonZero(table_size);
  switch (table_bits) {
#define CASE_(B)                                      \
    case B:                                           \
      BrotliCompressFragmentTwoPassImpl ## B(         \
          s, input, input_size, is_last, command_buf, \
          literal_buf, table, storage_ix, storage);   \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: BROTLI_DCHECK(0); break;
  }

  /* If output is larger than single uncompressed block, rewrite it. */
  if (*storage_ix - initial_storage_ix > 31 + (input_size << 3)) {
    RewindBitPosition(initial_storage_ix, storage_ix, storage);
    EmitUncompressedMetaBlock(input, input_size, storage_ix, storage);
  }

  if (is_last) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
  }
}